

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O0

void dpfb::readValuesForSize
               (Stream *stream,uint32_t subTablePos,LookupContext *ctx,int *values,int valueFormat)

{
  int16_t iVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_XMM0_Db;
  int local_4c;
  uint16_t deviceOffset;
  int i_2;
  int64_t prevPos;
  uint16_t auStack_38 [2];
  int i_1;
  uint16_t deviceOffsets [4];
  int i;
  int valueFormat_local;
  int *values_local;
  LookupContext *ctx_local;
  uint32_t subTablePos_local;
  Stream *stream_local;
  
  deviceOffsets[0] = 0;
  deviceOffsets[1] = 0;
  deviceOffsets._4_4_ = valueFormat;
  for (; (int)deviceOffsets._0_4_ < 4; deviceOffsets._0_4_ = deviceOffsets._0_4_ + 1) {
    if ((deviceOffsets._4_4_ & 1 << ((byte)deviceOffsets._0_4_ & 0x1f)) == 0) {
      values[(int)deviceOffsets._0_4_] = 0;
    }
    else {
      iVar1 = streams::Stream::readS16Be(stream);
      lVar5 = std::lround((double)CONCAT44(extraout_XMM0_Db,(float)(int)iVar1 * ctx->scale));
      values[(int)deviceOffsets._0_4_] = (int)lVar5;
    }
  }
  for (prevPos._4_4_ = 0; prevPos._4_4_ < 4; prevPos._4_4_ = prevPos._4_4_ + 1) {
    if ((deviceOffsets._4_4_ & 1 << ((char)prevPos._4_4_ + 4U & 0x1f)) == 0) {
      auStack_38[prevPos._4_4_] = 0;
    }
    else {
      uVar2 = streams::Stream::readU16Be(stream);
      auStack_38[prevPos._4_4_] = uVar2;
    }
  }
  iVar3 = (*stream->_vptr_Stream[8])();
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    if (auStack_38[local_4c] != 0) {
      (*stream->_vptr_Stream[7])(stream,(ulong)(subTablePos + auStack_38[local_4c]),0);
      iVar4 = readDeviceAdjsutment(stream,ctx->pxSize);
      values[local_4c] = iVar4 + values[local_4c];
    }
  }
  (*stream->_vptr_Stream[7])(stream,CONCAT44(extraout_var,iVar3),0);
  return;
}

Assistant:

static void readValuesForSize(
    Stream& stream,
    std::uint32_t subTablePos,
    const LookupContext& ctx,
    int values[numValues],
    int valueFormat)
{
    for (int i = 0; i < numValues; ++i)
        if (valueFormat & (1 << i))
            values[i] = std::lround(stream.readS16Be() * ctx.scale);
        else
            values[i] = 0;

    std::uint16_t deviceOffsets[numValues];
    for (int i = 0; i < numValues; ++i)
        if (valueFormat & (1 << (i + numValues)))
            deviceOffsets[i] = stream.readU16Be();
        else
            deviceOffsets[i] = 0;

    const auto prevPos = stream.getPosition();
    for (int i = 0; i < numValues; ++i) {
        const auto deviceOffset = deviceOffsets[i];
        if (deviceOffset == 0)
            continue;

        stream.seek(subTablePos + deviceOffset, SeekOrigin::set);
        values[i] += readDeviceAdjsutment(stream, ctx.pxSize);
    }
    stream.seek(prevPos, SeekOrigin::set);
}